

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::QPlainTextEdit(QPlainTextEdit *this,QString *text,QWidget *parent)

{
  QPlainTextEditPrivate *pQVar1;
  QAbstractScrollAreaPrivate *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  undefined8 *in_RDI;
  QPlainTextEditPrivate *d;
  QWidget *in_stack_ffffffffffffffe0;
  
  pQVar1 = (QPlainTextEditPrivate *)operator_new(0x360);
  QPlainTextEditPrivate::QPlainTextEditPrivate(pQVar1);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  *in_RDI = &PTR_metaObject_00d1d3a8;
  in_RDI[2] = &PTR__QPlainTextEdit_00d1d5a8;
  pQVar1 = d_func((QPlainTextEdit *)0x6c3e05);
  QPlainTextEditPrivate::init(pQVar1,in_RSI);
  return;
}

Assistant:

QPlainTextEdit::QPlainTextEdit(const QString &text, QWidget *parent)
    : QAbstractScrollArea(*new QPlainTextEditPrivate, parent)
{
    Q_D(QPlainTextEdit);
    d->init(text);
}